

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

pcp_flow_event_e fhndl_send_renew(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  long lVar1;
  pcp_errno pVar2;
  pcp_server_t *s;
  ulong uVar3;
  pcp_flow_event_e pVar4;
  
  s = get_pcp_server(f->ctx,f->pcp_server_indx);
  pVar4 = fev_failed;
  if (s != (pcp_server_t *)0x0) {
    pVar2 = pcp_flow_send_msg(f,s);
    if (pVar2 == PCP_ERR_SUCCESS) {
      gettimeofday((timeval *)&f->timeout,(__timezone_ptr_t)0x0);
      lVar1 = (f->timeout).tv_sec;
      uVar3 = f->recv_lifetime - lVar1;
      if (1 < uVar3) {
        (f->timeout).tv_sec = ((long)uVar3 >> 1) + lVar1;
        pVar4 = fev_msg_sent;
      }
    }
  }
  return pVar4;
}

Assistant:

static pcp_flow_event_e fhndl_send_renew(pcp_flow_t *f,
                                         UNUSED pcp_recv_msg_t *msg) {
    pcp_server_t *s = get_pcp_server(f->ctx, f->pcp_server_indx);
    long timeout_add;

    if (!s) {
        return fev_failed;
    }

    if (pcp_flow_send_msg(f, s) != PCP_ERR_SUCCESS) {
        return fev_failed;
    }

    gettimeofday(&f->timeout, NULL);
    timeout_add = (long)((f->recv_lifetime - f->timeout.tv_sec) >> 1);

    if (timeout_add == 0) {
        return fev_failed;
    } else {
        f->timeout.tv_sec += timeout_add;
    }

    return fev_msg_sent;
}